

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  processingInstructionSAXFunc UNRECOVERED_JUMPTABLE;
  int iVar3;
  uint val;
  xmlCatalogAllow xVar4;
  xmlChar *pxVar5;
  byte *str1;
  ulong uVar6;
  xmlChar *pxVar7;
  void *pvVar8;
  char *msg;
  long lVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  byte *pbVar13;
  byte *pbVar14;
  int l;
  
  uVar10 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar10 = 10000000;
  }
  pxVar2 = ctxt->input;
  pxVar5 = pxVar2->cur;
  if (*pxVar5 != '<') {
    return;
  }
  if (pxVar5[1] != '?') {
    return;
  }
  pxVar2->cur = pxVar5 + 2;
  pxVar2->col = pxVar2->col + 2;
  if (pxVar5[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  pxVar5 = xmlParsePITarget(ctxt);
  if (pxVar5 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
    return;
  }
  pxVar2 = ctxt->input;
  pxVar7 = pxVar2->cur;
  if ((*pxVar7 == '?') && (pxVar7[1] == '>')) {
    pxVar2->cur = pxVar7 + 2;
    pxVar2->col = pxVar2->col + 2;
    if (pxVar7[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    if (ctxt->sax == (_xmlSAXHandler *)0x0) {
      return;
    }
    if (ctxt->disableSAX != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE = ctxt->sax->processingInstruction;
    if (UNRECOVERED_JUMPTABLE == (processingInstructionSAXFunc)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar5,(xmlChar *)0x0);
    return;
  }
  str1 = (byte *)(*xmlMalloc)(100);
  if (str1 == (byte *)0x0) {
    xmlCtxtErrMemory(ctxt);
    return;
  }
  iVar3 = xmlSkipBlankChars(ctxt);
  if (iVar3 == 0) {
    xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar5);
  }
  lVar9 = 0;
  uVar6 = 100;
LAB_001369a7:
  val = xmlCurrentCharRecover(ctxt,&l);
  if (0xff < (int)val) {
    if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) goto LAB_00136a23;
LAB_00136afa:
    str1[lVar9] = 0;
    msg = "ParsePI: PI %s never end ...\n";
LAB_00136b30:
    xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,msg,pxVar5);
    goto LAB_00136b44;
  }
  if ((int)val < 0x20) {
    if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_00136afa;
LAB_00136a23:
    sVar12 = uVar6;
    pbVar13 = str1;
    if (uVar6 <= lVar9 + 5U) {
      sVar12 = 1;
      if (uVar6 != 0) {
        iVar3 = (int)uVar6;
        if ((int)uVar10 <= iVar3) {
          msg = "PI %s too big found";
          goto LAB_00136b30;
        }
        uVar11 = iVar3 + 1U >> 1;
        sVar12 = (size_t)(uVar11 + iVar3);
        if ((int)(uVar10 - uVar11) < iVar3) {
          sVar12 = (size_t)uVar10;
        }
      }
      pbVar13 = (byte *)(*xmlRealloc)(str1,sVar12);
      if (pbVar13 == (byte *)0x0) goto LAB_00136b0e;
    }
    if (val < 0x80) {
      pbVar13[lVar9] = (byte)val;
      lVar9 = lVar9 + 1;
    }
    else {
      iVar3 = xmlCopyCharMultiByte(pbVar13 + lVar9,val);
      lVar9 = lVar9 + iVar3;
    }
    pxVar2 = ctxt->input;
    if (*pxVar2->cur == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    pxVar2->cur = pxVar2->cur + l;
    uVar6 = sVar12;
    str1 = pbVar13;
    goto LAB_001369a7;
  }
  if ((val != 0x3f) || (ctxt->input->cur[1] != '>')) goto LAB_00136a23;
  str1[lVar9] = 0;
  pxVar2 = ctxt->input;
  pxVar7 = pxVar2->cur;
  pxVar2->cur = pxVar7 + 2;
  pxVar2->col = pxVar2->col + 2;
  if (pxVar7[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  if ((((ctxt->inSubset != 0) ||
       (iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"oasis-xml-catalog"), iVar3 == 0)) ||
      (xVar4 = xmlCatalogGetDefaults(), (ctxt->options & 0x4000000) == 0)) ||
     (pbVar13 = str1, (xVar4 & ~XML_CATA_ALLOW_GLOBAL) != XML_CATA_ALLOW_DOCUMENT))
  goto LAB_00136b88;
  while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
    pbVar13 = pbVar13 + 1;
  }
  iVar3 = xmlStrncmp(pbVar13,"catalog",7);
  if (iVar3 != 0) goto LAB_00136c21;
  for (pbVar13 = pbVar13 + 9; uVar6 = (ulong)pbVar13[-2], uVar6 < 0x3e; pbVar13 = pbVar13 + 1) {
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0x3d) goto LAB_00136c80;
      break;
    }
  }
  goto LAB_00136b88;
LAB_00136b0e:
  xmlCtxtErrMemory(ctxt);
  goto LAB_00136b44;
LAB_00136c80:
  uVar6 = (ulong)pbVar13[-1];
  if (0x27 < uVar6) goto LAB_00136c21;
  if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
    if ((0x8400000000U >> (uVar6 & 0x3f) & 1) != 0) {
      iVar3 = -1;
      pbVar14 = pbVar13;
      goto LAB_00136cb1;
    }
    goto LAB_00136c21;
  }
  pbVar13 = pbVar13 + 1;
  goto LAB_00136c80;
  while (bVar1 != pbVar13[-1]) {
LAB_00136cb1:
    bVar1 = *pbVar14;
    pbVar14 = pbVar14 + 1;
    iVar3 = iVar3 + 1;
    if (bVar1 == 0) break;
  }
  if (bVar1 == 0) {
LAB_00136c21:
    pxVar7 = (xmlChar *)0x0;
  }
  else {
    pxVar7 = xmlStrndup(pbVar13,iVar3);
    for (; uVar6 = (ulong)*pbVar14, uVar6 < 0x21; pbVar14 = pbVar14 + 1) {
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0) {
          if (pxVar7 == (xmlChar *)0x0) goto LAB_00136b88;
          pvVar8 = xmlCatalogAddLocal(ctxt->catalogs,pxVar7);
          ctxt->catalogs = pvVar8;
          goto LAB_00136c46;
        }
        break;
      }
    }
  }
  xmlWarningMsg(ctxt,XML_WAR_CATALOG_PI,"Catalog PI syntax error: %s\n",str1,(xmlChar *)0x0);
  if (pxVar7 != (xmlChar *)0x0) {
LAB_00136c46:
    (*xmlFree)(pxVar7);
  }
LAB_00136b88:
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
     (UNRECOVERED_JUMPTABLE = ctxt->sax->processingInstruction,
     UNRECOVERED_JUMPTABLE != (processingInstructionSAXFunc)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar5,str1);
  }
LAB_00136b44:
  (*xmlFree)(str1);
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;

    if ((RAW == '<') && (NXT(1) == '?')) {
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		return;
	    }
	    buf = xmlMalloc(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt);
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = xmlCurrentCharRecover(ctxt, &l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        return;
                    }
		    tmp = xmlRealloc(buf, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buf);
			return;
		    }
		    buf = tmp;
                    size = newSize;
		}
		COPY_BUF(buf, len, cur);
		NEXTL(l);
		cur = xmlCurrentCharRecover(ctxt, &l);
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if ((ctxt->inSubset == 0) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();

		    if ((ctxt->options & XML_PARSE_CATALOG_PI) &&
                        ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			 (allow == XML_CATA_ALLOW_ALL)))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
    }
}